

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O2

GMM_STATUS __thiscall
GmmLib::GmmGen7TextureCalc::FillTex3D
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  anon_struct_8_45_9b07292e_for_Gpu aVar4;
  __GMM_BUFFER_TYPE *pBufferType;
  GmmTextureCalc *this_00;
  uint8_t uVar5;
  uint uVar6;
  int iVar7;
  GMM_STATUS GVar8;
  uint32_t uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t local_78;
  uint32_t local_74;
  uint32_t CompressHeight;
  uint32_t CompressDepth;
  __GMM_BUFFER_TYPE *local_68;
  GMM_PLATFORM_INFO *local_60;
  uint32_t local_58;
  uint32_t uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  GmmTextureCalc *local_40;
  uint local_34 [2];
  uint32_t CompressWidth;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  local_68 = pRestrictions;
  local_60 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  uVar9 = pTexInfo->BitsPerPixel;
  uVar14 = (uint)pTexInfo->BaseWidth;
  local_58 = pTexInfo->Depth;
  uVar3 = (pTexInfo->Alignment).HAlign;
  local_40 = &this->super_GmmTextureCalc;
  uVar5 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  GmmTextureCalc::GetCompressionBlockDimensions
            (local_40,pTexInfo->Format,local_34,&local_78,&local_74);
  this_00 = local_40;
  pBufferType = local_68;
  aVar4 = (pTexInfo->Flags).Gpu;
  uVar6 = (uVar3 - 1) + uVar14;
  uVar10 = 0;
  uVar12 = 0;
  do {
    if (pTexInfo->MaxLod + 1 == uVar10) {
      uVar6 = local_68->MinPitch;
      if (local_68->MinPitch < uVar12) {
        uVar6 = uVar12;
      }
      uVar6 = -local_68->PitchAlignment & (local_68->PitchAlignment - 1) + uVar6;
      _CompressHeight = pTexInfo;
      uStack_54 = GetTotal3DHeight((GmmGen7TextureCalc *)local_40,pTexInfo);
      if (local_60->TileInfo[pTexInfo->TileMode].LogicalSize != 0) {
        uVar1 = local_60->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
        uVar2 = local_60->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        uVar6 = uVar6 + uVar1 + -1 & -uVar1;
        uStack_54 = uStack_54 + uVar2 + -1 & -uVar2;
      }
      uStack_50 = 0;
      uStack_4c = 0;
      local_58 = uVar6;
      uVar5 = GmmIsYUVPacked(pTexInfo->Format);
      if (((uVar5 != '\0') || (pTexInfo->BitsPerPixel == 0x60)) ||
         (uVar9 = uStack_54, pTexInfo->BitsPerPixel == 0x30)) {
        if (local_58 == 0) {
          iVar7 = 0x11;
        }
        else {
          iVar7 = (local_58 + 0xf) / local_58 + 1;
        }
        uVar9 = uStack_54 + iVar7;
      }
      GVar8 = GmmTextureCalc::FillTexPitchAndSize
                        (this_00,pTexInfo,(ulong)local_58,uVar9 + 1 & 0xfffffffe,pBufferType);
      if (GVar8 == GMM_SUCCESS) {
        Fill3DTexOffsetAddress((GmmGen7TextureCalc *)this_00,pTexInfo);
        GVar8 = GMM_SUCCESS;
      }
      return GVar8;
    }
    uVar6 = uVar6 & -uVar3;
    if (uVar5 == '\0') {
      if ((aVar4._0_4_ >> 0x1d & 1) == 0) {
        if (((ulong)aVar4 & 2) != 0) {
          if (((ulong)aVar4 >> 0x29 & 1) == 0) {
            if (((ulong)aVar4 >> 0x28 & 1) != 0) {
              if (uVar9 == 0x80) {
LAB_001b0a90:
                uVar6 = uVar6 >> 2;
              }
              else if (uVar9 == 0x40) {
LAB_001b0a8b:
                uVar6 = uVar6 >> 3;
              }
              else if (uVar9 == 0x20) {
                uVar6 = uVar6 >> 4;
              }
            }
          }
          else if (uVar9 == 0x80) {
            uVar6 = uVar6 >> 1;
          }
          else {
            if (uVar9 == 0x40) goto LAB_001b0a90;
            if (uVar9 == 0x20) goto LAB_001b0a8b;
          }
        }
      }
      else {
        uVar6 = uVar6 * 2;
      }
    }
    else {
      uVar6 = uVar6 / local_34[0];
    }
    uVar13 = local_58 >> ((byte)uVar10 & 0x1f);
    uVar13 = uVar13 + (uVar13 == 0);
    uVar11 = (uint)(1L << ((byte)uVar10 & 0x3f));
    if (uVar11 <= uVar13) {
      uVar13 = uVar11;
    }
    uVar6 = uVar13 * uVar9 * uVar6 >> 3;
    if (uVar12 <= uVar6) {
      uVar12 = uVar6;
    }
    uVar14 = (uVar14 >> 1) + (uint)(uVar14 >> 1 == 0);
    uVar6 = uVar14 + (uVar3 - 1);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen7TextureCalc::FillTex3D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   AlignedMipWidth;
    uint32_t   BitsPerPixel;
    uint32_t   Depth, Height, Width;
    uint32_t   i, MipsInThisRow, MipWidth;
    uint32_t   RenderPitch = 0, ThisRowPitch;
    uint32_t   UnitAlignWidth;
    uint32_t   Total3DHeight;
    uint32_t   WidthBytesPhysical;
    uint8_t    Compress;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;
    bool       SeparateStencil;
    GMM_STATUS Status;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    const __GMM_PLATFORM_RESOURCE *pPlatformResource = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    Height       = pTexInfo->BaseHeight;
    Width        = GFX_ULONG_CAST(pTexInfo->BaseWidth);
    Depth        = pTexInfo->Depth;

    // Align before we compress
    UnitAlignWidth = pTexInfo->Alignment.HAlign;
    Compress       = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);
    SeparateStencil = pTexInfo->Flags.Gpu.SeparateStencil ? true : false;

    // Unaligned MipMap dimension variables
    MipWidth = Width;

    // Aligned MipMap dimension variables
    AlignedMipWidth = GFX_ALIGN(MipWidth, UnitAlignWidth);

    // Calculate the render pitch exactly the same way we do the
    // offset for each Mip level
    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        if(Compress)
        {
            // If there is compression, compress after the alignment at each level
            AlignedMipWidth /= CompressWidth;
        }
        else if(SeparateStencil)
        {
            AlignedMipWidth *= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS)
        {
            if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
            {
                switch(BitsPerPixel)
                {
                    case 32:
                        AlignedMipWidth /= 8;
                        break;
                    case 64:
                        AlignedMipWidth /= 4;
                        break;
                    case 128:
                        AlignedMipWidth /= 2;
                        break;
                    default:
                        __GMM_ASSERT(0);
                }
            }
            else if(pTexInfo->Flags.Gpu.__NonMsaaTileXCcs)
            {
                switch(BitsPerPixel)
                {
                    case 32:
                        AlignedMipWidth /= 16;
                        break;
                    case 64:
                        AlignedMipWidth /= 8;
                        break;
                    case 128:
                        AlignedMipWidth /= 4;
                        break;
                    default:
                        __GMM_ASSERT(0);
                }
            }
        }

        // See how many mip can fit in one row
        MipsInThisRow = GFX_2_TO_POWER_OF(i);

        // LOD planes may be less than MipsInThisRow, take the smaller value for pitch
        MipsInThisRow = GFX_MIN(GFX_MAX(1, (Depth >> i)), MipsInThisRow);
        ThisRowPitch  = AlignedMipWidth * MipsInThisRow;

        // Default pitch
        WidthBytesPhysical = ThisRowPitch * BitsPerPixel >> 3;

        if(RenderPitch < WidthBytesPhysical)
        {
            RenderPitch = WidthBytesPhysical;
        }

        MipWidth >>= 1;
        // Clamp such that mip width is at least 1
        MipWidth        = GFX_MAX(MipWidth, 1);
        AlignedMipWidth = GFX_ALIGN(MipWidth, UnitAlignWidth);
    }

    WidthBytesPhysical = RenderPitch;

    // Make sure the pitch satisfy linear min pitch requirment
    WidthBytesPhysical = GFX_MAX(WidthBytesPhysical,
                                 pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                   pRestrictions->PitchAlignment);

    // Get Total height for the entire 3D texture
    Total3DHeight = GetTotal3DHeight(pTexInfo);

    if(GMM_IS_TILED(pPlatformResource->TileInfo[pTexInfo->TileMode]))
    {
        // Align to tile boundary
        Total3DHeight = GFX_ALIGN(Total3DHeight,
                                  pPlatformResource->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical,
                                       pPlatformResource->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
    }

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        Total3DHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), WidthBytesPhysical);
    }

    Total3DHeight = GFX_ALIGN(Total3DHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, WidthBytesPhysical, Total3DHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill3DTexOffsetAddress(pTexInfo);
    }

    GMM_DPF_EXIT;
    return (Status);
}